

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTVisitor.h
# Opt level: O0

void __thiscall
slang::ast::ASTVisitor<CollectLHSSymbols,_true,_true,_false,_false>::
visit<slang::ast::CoverageBinSymbol>
          (ASTVisitor<CollectLHSSymbols,_true,_true,_false,_false> *this,CoverageBinSymbol *t)

{
  ASTVisitor<CollectLHSSymbols,_true,_true,_false,_false> *in_RSI;
  CoverageBinSymbol *in_stack_ffffffffffffffe8;
  
  visitDefault<slang::ast::CoverageBinSymbol>(in_RSI,in_stack_ffffffffffffffe8);
  return;
}

Assistant:

void visit(const T& t) {
        if constexpr (!VisitBad && requires { t.bad(); }) {
            if (t.bad())
                return;
        }

        if constexpr (requires { (DERIVED).handle(t); })
            (DERIVED).handle(t);
        else if constexpr (requires { (DERIVED)(DERIVED, t); })
            (DERIVED)(DERIVED, t);
        else
            visitDefault(t);
    }